

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlAttrPtr xmlNewPropInternal(xmlNodePtr node,xmlNsPtr ns,xmlChar *name,xmlChar *value,int eatname)

{
  xmlDictPtr dict;
  bool bVar1;
  bool bVar2;
  int iVar3;
  xmlNodePtr attr;
  _xmlDoc *doc;
  xmlChar *pxVar4;
  xmlNodePtr pxVar5;
  _xmlNode *p_Var6;
  _xmlNode *p_Var7;
  xmlRegisterNodeFunc *pp_Var8;
  
  if ((node == (xmlNodePtr)0x0) || (node->type == XML_ELEMENT_NODE)) {
    attr = (xmlNodePtr)(*xmlMalloc)(0x68);
    if (attr != (xmlNodePtr)0x0) {
      attr->_private = (void *)0x0;
      *(undefined8 *)&attr->type = 0;
      attr->last = (_xmlNode *)0x0;
      attr->parent = (_xmlNode *)0x0;
      attr->content = (xmlChar *)0x0;
      attr->properties = (_xmlAttr *)0x0;
      attr->doc = (_xmlDoc *)0x0;
      attr->ns = (xmlNs *)0x0;
      attr->next = (_xmlNode *)0x0;
      attr->prev = (_xmlNode *)0x0;
      attr->name = (xmlChar *)0x0;
      attr->children = (_xmlNode *)0x0;
      attr->nsDef = (xmlNs *)0x0;
      attr->type = XML_ATTRIBUTE_NODE;
      attr->parent = node;
      if (node == (xmlNodePtr)0x0) {
        doc = (xmlDocPtr)0x0;
      }
      else {
        doc = node->doc;
        attr->doc = doc;
      }
      attr->ns = ns;
      if (eatname == 0) {
        if ((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) {
          pxVar4 = xmlStrdup(name);
        }
        else {
          pxVar4 = xmlDictLookup(doc->dict,name,-1);
        }
        attr->name = pxVar4;
        if (pxVar4 == (xmlChar *)0x0) goto LAB_0014cd3a;
      }
      else {
        attr->name = name;
      }
      if (value == (xmlChar *)0x0) goto LAB_0014cd16;
      pxVar5 = xmlNewText(value);
      if (pxVar5 != (xmlNodePtr)0x0) {
        pxVar5->doc = doc;
      }
      attr->children = pxVar5;
      if (pxVar5 == (xmlNodePtr)0x0) {
        bVar2 = true;
      }
      else {
        attr->last = (_xmlNode *)0x0;
        for (p_Var6 = attr->children; p_Var6 != (_xmlNode *)0x0; p_Var6 = p_Var6->next) {
          p_Var6->parent = attr;
          if (p_Var6->next == (_xmlNode *)0x0) {
            attr->last = p_Var6;
          }
        }
        if (doc != (xmlDocPtr)0x0) {
          iVar3 = xmlIsID(doc,node,(xmlAttrPtr)attr);
          bVar2 = true;
          if ((iVar3 < 0) ||
             ((iVar3 == 1 && (iVar3 = xmlAddIDSafe((xmlAttrPtr)attr,value), iVar3 < 0)))) {
            bVar1 = false;
          }
          else {
            bVar2 = false;
            bVar1 = true;
          }
          if (!bVar1) goto LAB_0014cd0d;
        }
        bVar2 = false;
      }
LAB_0014cd0d:
      if (bVar2) {
LAB_0014cd3a:
        xmlFreeProp((xmlAttrPtr)attr);
        return (xmlAttrPtr)0x0;
      }
      if (bVar2) {
        return (xmlAttrPtr)attr;
      }
LAB_0014cd16:
      if (node != (xmlNodePtr)0x0) {
        p_Var6 = (_xmlNode *)node->properties;
        if ((_xmlNode *)node->properties == (_xmlNode *)0x0) {
          node->properties = (_xmlAttr *)attr;
        }
        else {
          do {
            p_Var7 = p_Var6;
            p_Var6 = p_Var7->next;
          } while (p_Var7->next != (_xmlNode *)0x0);
          p_Var7->next = attr;
          attr->prev = p_Var7;
        }
      }
      if (xmlRegisterCallbacks != 0) {
        pp_Var8 = __xmlRegisterNodeDefaultValue();
        if (*pp_Var8 != (xmlRegisterNodeFunc)0x0) {
          pp_Var8 = __xmlRegisterNodeDefaultValue();
          (**pp_Var8)(attr);
          return (xmlAttrPtr)attr;
        }
        return (xmlAttrPtr)attr;
      }
      return (xmlAttrPtr)attr;
    }
    if (eatname != 1) {
      return (xmlAttrPtr)0x0;
    }
    if (node == (xmlNodePtr)0x0) goto LAB_0014cc17;
  }
  else if (eatname != 1) {
    return (xmlAttrPtr)0x0;
  }
  if (((node->doc != (_xmlDoc *)0x0) && (dict = node->doc->dict, dict != (xmlDictPtr)0x0)) &&
     (iVar3 = xmlDictOwns(dict,name), iVar3 != 0)) {
    return (xmlAttrPtr)0x0;
  }
LAB_0014cc17:
  (*xmlFree)(name);
  return (xmlAttrPtr)0x0;
}

Assistant:

static xmlAttrPtr
xmlNewPropInternal(xmlNodePtr node, xmlNsPtr ns,
                   const xmlChar * name, const xmlChar * value,
                   int eatname)
{
    xmlAttrPtr cur;
    xmlDocPtr doc = NULL;

    if ((node != NULL) && (node->type != XML_ELEMENT_NODE)) {
        if ((eatname == 1) &&
	    ((node->doc == NULL) || (node->doc->dict == NULL) ||
	     (!(xmlDictOwns(node->doc->dict, name)))))
            xmlFree((xmlChar *) name);
        return (NULL);
    }

    /*
     * Allocate a new property and fill the fields.
     */
    cur = (xmlAttrPtr) xmlMalloc(sizeof(xmlAttr));
    if (cur == NULL) {
        if ((eatname == 1) &&
	    ((node == NULL) || (node->doc == NULL) ||
             (node->doc->dict == NULL) ||
	     (!(xmlDictOwns(node->doc->dict, name)))))
            xmlFree((xmlChar *) name);
        return (NULL);
    }
    memset(cur, 0, sizeof(xmlAttr));
    cur->type = XML_ATTRIBUTE_NODE;

    cur->parent = node;
    if (node != NULL) {
        doc = node->doc;
        cur->doc = doc;
    }
    cur->ns = ns;

    if (eatname == 0) {
        if ((doc != NULL) && (doc->dict != NULL))
            cur->name = (xmlChar *) xmlDictLookup(doc->dict, name, -1);
        else
            cur->name = xmlStrdup(name);
        if (cur->name == NULL)
            goto error;
    } else
        cur->name = name;

    if (value != NULL) {
        xmlNodePtr tmp;

        cur->children = xmlNewDocText(doc, value);
        if (cur->children == NULL)
            goto error;
        cur->last = NULL;
        tmp = cur->children;
        while (tmp != NULL) {
            tmp->parent = (xmlNodePtr) cur;
            if (tmp->next == NULL)
                cur->last = tmp;
            tmp = tmp->next;
        }

        if (doc != NULL) {
            int res = xmlIsID(doc, node, cur);

            if (res < 0)
                goto error;
            if ((res == 1) && (xmlAddIDSafe(cur, value) < 0))
                goto error;
        }
    }

    /*
     * Add it at the end to preserve parsing order ...
     */
    if (node != NULL) {
        if (node->properties == NULL) {
            node->properties = cur;
        } else {
            xmlAttrPtr prev = node->properties;

            while (prev->next != NULL)
                prev = prev->next;
            prev->next = cur;
            cur->prev = prev;
        }
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
        xmlRegisterNodeDefaultValue((xmlNodePtr) cur);
    return (cur);

error:
    xmlFreeProp(cur);
    return(NULL);
}